

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O0

int __thiscall AvlTree<Worker>::find(AvlTree<Worker> *this,Worker *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  shared_ptr<const_AvlTree<Worker>::Node> local_60;
  undefined4 local_4c;
  shared_ptr<const_AvlTree<Worker>::Node> local_48;
  undefined1 local_38 [8];
  shared_ptr<AvlTree<Worker>::Node> it;
  int foundIndex;
  Worker *obj_local;
  AvlTree<Worker> *this_local;
  
  it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0;
  std::shared_ptr<AvlTree<Worker>::Node>::shared_ptr
            ((shared_ptr<AvlTree<Worker>::Node> *)local_38,&this->m_Root);
  do {
    bVar1 = std::operator!=((shared_ptr<AvlTree<Worker>::Node> *)local_38,(nullptr_t)0x0);
    if (!bVar1) {
      this_local._4_4_ = -1;
LAB_00103268:
      local_4c = 1;
      std::shared_ptr<AvlTree<Worker>::Node>::~shared_ptr
                ((shared_ptr<AvlTree<Worker>::Node> *)local_38);
      return this_local._4_4_;
    }
    peVar4 = std::
             __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    bVar1 = operator<(obj,&peVar4->key);
    if (!bVar1) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      bVar1 = operator<(&peVar4->key,obj);
      iVar3 = it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_;
      if (!bVar1) {
        peVar4 = std::
                 __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        std::shared_ptr<AvlTree<Worker>::Node_const>::shared_ptr<AvlTree<Worker>::Node,void>
                  ((shared_ptr<AvlTree<Worker>::Node_const> *)&local_48,&peVar4->left);
        iVar2 = _size(this,&local_48);
        this_local._4_4_ = iVar3 + iVar2;
        std::shared_ptr<const_AvlTree<Worker>::Node>::~shared_ptr(&local_48);
        goto LAB_00103268;
      }
    }
    peVar4 = std::
             __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    bVar1 = operator<(obj,&peVar4->key);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::shared_ptr<AvlTree<Worker>::Node>::operator=
                ((shared_ptr<AvlTree<Worker>::Node> *)local_38,&peVar4->left);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::shared_ptr<AvlTree<Worker>::Node_const>::shared_ptr<AvlTree<Worker>::Node,void>
                ((shared_ptr<AvlTree<Worker>::Node_const> *)&local_60,&peVar4->left);
      iVar3 = _size(this,&local_60);
      it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = iVar3 + 1 +
              it.super___shared_ptr<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_;
      std::shared_ptr<const_AvlTree<Worker>::Node>::~shared_ptr(&local_60);
      peVar4 = std::
               __shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<AvlTree<Worker>::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::shared_ptr<AvlTree<Worker>::Node>::operator=
                ((shared_ptr<AvlTree<Worker>::Node> *)local_38,&peVar4->right);
    }
  } while( true );
}

Assistant:

int find(const T& obj) const
    {
        int foundIndex = 0;
        auto it = m_Root;

        while(it != nullptr)
        {
            if(!(obj < it->key) && !(it->key < obj))
                return foundIndex + _size(it->left);
            if(obj < it->key)
            {
                it = it->left;
            }
            else
            {
                foundIndex += _size(it->left) + 1;
                it = it->right;
            }
        }
        return -1;
    }